

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int yyGrowStack(yyParser *p)

{
  int iVar1;
  yyStackEntry *pyVar2;
  yyStackEntry *pOld;
  int iVar3;
  yyStackEntry *__dest;
  sqlite3_uint64 newSize;
  
  pyVar2 = p->yytos;
  pOld = p->yystack;
  iVar3 = (int)((ulong)((long)p->yystackEnd - (long)pOld) >> 3);
  iVar1 = iVar3 * 0x55555556;
  newSize = (long)(iVar1 + 2) * 0x18 + 0x960;
  if (pOld == p->yystk0) {
    __dest = (yyStackEntry *)parserStackRealloc((void *)0x0,newSize);
    if (__dest != (yyStackEntry *)0x0) {
      memcpy(__dest,p->yystack,(long)(iVar3 * -0x55555555 + 1) * 0x18);
      goto LAB_0015faec;
    }
  }
  else {
    __dest = (yyStackEntry *)parserStackRealloc(pOld,newSize);
    if (__dest != (yyStackEntry *)0x0) {
LAB_0015faec:
      p->yystack = __dest;
      p->yytos = __dest + (int)((long)pyVar2 - (long)pOld >> 3) * -0x55555555;
      p->yystackEnd = __dest + (iVar1 + 0x65);
      return 0;
    }
  }
  return 1;
}

Assistant:

static int yyGrowStack(yyParser *p){
  int oldSize = 1 + (int)(p->yystackEnd - p->yystack);
  int newSize;
  int idx;
  yyStackEntry *pNew;

  newSize = oldSize*2 + 100;
  idx = (int)(p->yytos - p->yystack);
  if( p->yystack==p->yystk0 ){
    pNew = YYREALLOC(0, newSize*sizeof(pNew[0]));
    if( pNew==0 ) return 1;
    memcpy(pNew, p->yystack, oldSize*sizeof(pNew[0]));
  }else{
    pNew = YYREALLOC(p->yystack, newSize*sizeof(pNew[0]));
    if( pNew==0 ) return 1;
  }
  p->yystack = pNew;
  p->yytos = &p->yystack[idx];
#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sStack grows from %d to %d entries.\n",
            yyTracePrompt, oldSize, newSize);
  }
#endif
  p->yystackEnd = &p->yystack[newSize-1];
  return 0;
}